

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O1

void __thiscall
mir::inst::CallInst::CallInst
          (CallInst *this,VarId *_dest,string *_func,
          vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *_params)

{
  uint32_t uVar1;
  pointer pcVar2;
  
  uVar1 = _dest->id;
  (this->super_Inst).dest.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
  (this->super_Inst).dest.id = uVar1;
  (this->super_Inst).super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001f0138;
  (this->func)._M_dataplus._M_p = (pointer)&(this->func).field_2;
  pcVar2 = (_func->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->func,pcVar2,pcVar2 + _func->_M_string_length);
  std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::vector(&this->params,_params);
  return;
}

Assistant:

CallInst(VarId _dest, std::string _func, std::vector<Value> _params)
      : Inst(_dest), func(_func), params(_params) {}